

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_visibility.hpp
# Opt level: O2

vector<bool,_std::allocator<bool>_> *
eos::render::compute_per_vertex_self_occlusion
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,
          vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
          *vertices,
          vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
          *triangle_vertex_indices,Matrix4f *modelview,RayDirection ray_direction_type)

{
  anon_class_16_2_aecbacc2 __f;
  vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  viewspace_vertices;
  _Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __f.modelview = modelview;
  __f.viewspace_vertices =
       (vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        *)&local_38;
  std::
  for_each<__gnu_cxx::__normal_iterator<Eigen::Matrix<float,3,1,0,3,1>const*,std::vector<Eigen::Matrix<float,3,1,0,3,1>,std::allocator<Eigen::Matrix<float,3,1,0,3,1>>>>,eos::render::compute_per_vertex_self_occlusion(std::vector<Eigen::Matrix<float,3,1,0,3,1>,std::allocator<Eigen::Matrix<float,3,1,0,3,1>>>const&,std::vector<std::array<int,3ul>,std::allocator<std::array<int,3ul>>>const&,Eigen::Matrix<float,4,4,0,4,4>const&,eos::render::detail::RayDirection)::_lambda(auto:1_const&)_1_>
            ((vertices->
             super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (vertices->
             super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,__f);
  compute_per_vertex_self_occlusion
            (__return_storage_ptr__,
             (vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              *)&local_38,triangle_vertex_indices,ray_direction_type);
  std::
  _Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<bool>
compute_per_vertex_self_occlusion(const std::vector<Eigen::Vector3f>& vertices,
                                  const std::vector<std::array<int, 3>>& triangle_vertex_indices,
                                  const Eigen::Matrix4f& modelview, detail::RayDirection ray_direction_type)
{
    std::vector<Eigen::Vector3f> viewspace_vertices;
    std::for_each(std::begin(vertices), std::end(vertices), [&viewspace_vertices, &modelview](const auto& v) {
        const Eigen::Vector4f transformed_vertex = modelview * v.homogeneous();
        viewspace_vertices.push_back(transformed_vertex.head<3>());
    });

    return compute_per_vertex_self_occlusion(viewspace_vertices, triangle_vertex_indices, ray_direction_type);
}